

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall CMU462::Application::to_model_mode(Application *this)

{
  Scene *pSVar1;
  Mesh *this_00;
  Mesh *pMVar2;
  _Base_ptr p_Var3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if (*(int *)&(this->super_Renderer).field_0xc != 0) {
    PathTracer::stop(this->pathtracer);
    PathTracer::clear(this->pathtracer);
    *(undefined4 *)&(this->super_Renderer).field_0xc = 0;
    pSVar1 = this->scene;
    for (p_Var3 = (pSVar1->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(pSVar1->objects)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      this_00 = *(Mesh **)(p_Var3 + 1);
      (*(this_00->super_SceneObject)._vptr_SceneObject[5])(&local_48);
      if (*((local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p == 'M') {
        pMVar2 = (Mesh *)this->scene->elementTransform;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
        if (this_00 != pMVar2) {
          DynamicScene::Mesh::resetWave(this_00);
        }
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
      }
    }
    this->action = Navigate;
    mouse_moved(this,this->mouseX,this->mouseY);
    setGhosted(this,false);
  }
  return;
}

Assistant:

void Application::to_model_mode() {
  if (mode == MODEL_MODE) return;
  pathtracer->stop();
  pathtracer->clear();
  mode = MODEL_MODE;
  for (auto o : scene->objects) {
    if (o->getInfo()[0][0] == 'M' && o != scene->elementTransform) { // Mesh
      ((DynamicScene::Mesh*)o)->resetWave();
    }
  }

  action = Action::Navigate;
  mouse_moved(mouseX, mouseY);
  setGhosted(false);
}